

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  size_type sVar3;
  cmGeneratorTarget *pcVar4;
  pointer pbVar5;
  pointer pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  undefined7 extraout_var;
  char *pcVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  long lVar13;
  long *plVar14;
  string *psVar15;
  LinkClosure *pLVar16;
  size_type *psVar17;
  ulong *puVar18;
  pointer pbVar19;
  byte bVar20;
  undefined8 uVar21;
  _Alloc_hider _Var22;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar23;
  string d;
  string rootPath;
  string suffix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string targetOutputDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_138;
  byte local_112;
  byte local_111;
  string local_110;
  undefined4 local_ec;
  string local_e8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_c8;
  undefined1 local_c0 [32];
  _Base_ptr local_a0;
  size_t local_98;
  string *local_90;
  string *local_88;
  string local_80;
  string *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string *local_38;
  
  pcVar2 = this->Makefile;
  pcVar6 = local_c0 + 0x10;
  local_c8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)runtimeDirs;
  local_c0._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"CMAKE_SKIP_RPATH","");
  bVar7 = cmMakefile::IsOn(pcVar2,(string *)local_c0);
  sVar3 = (this->RuntimeFlag)._M_string_length;
  if ((pointer)local_c0._0_8_ != pcVar6) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  bVar8 = true;
  if (!for_install) {
    pcVar4 = this->Target;
    local_c0._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"BUILD_WITH_INSTALL_RPATH","");
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)local_c0);
    if ((pointer)local_c0._0_8_ != pcVar6) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
  }
  if (bVar7 || sVar3 == 0) {
    bVar20 = 0;
LAB_002d59e8:
    bVar10 = 0;
    local_ec = 0;
  }
  else {
    bVar7 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target);
    bVar9 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    bVar20 = bVar9 & (bVar8 ^ 1U);
    if ((bVar8 ^ 1U) != 0) goto LAB_002d59e8;
    pcVar2 = this->Makefile;
    local_c0._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"CMAKE_SKIP_INSTALL_RPATH","");
    bVar9 = cmMakefile::IsOn(pcVar2,(string *)local_c0);
    if (bVar9) {
      local_ec = 0;
    }
    else {
      pcVar4 = this->Target;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"INSTALL_RPATH_USE_LINK_PATH","");
      bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,&local_80);
      local_ec = (undefined4)CONCAT71(extraout_var,bVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    if ((pointer)local_c0._0_8_ != pcVar6) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    bVar10 = bVar8 & bVar7;
  }
  pcVar2 = this->Makefile;
  local_c0._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN","");
  local_88 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_c0);
  if ((pointer)local_c0._0_8_ != pcVar6) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  psVar15 = &this->Config;
  cmGeneratorTarget::GetDirectory(&local_80,this->Target,psVar15,RuntimeBinaryArtifact);
  pcVar4 = this->Target;
  local_c0._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"BUILD_RPATH_USE_ORIGIN","");
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)local_c0);
  local_111 = local_88->_M_string_length != 0;
  local_112 = local_80._M_string_length != 0;
  if ((pointer)local_c0._0_8_ != pcVar6) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  local_c0._24_8_ = local_c0 + 8;
  local_c0._8_4_ = _S_red;
  local_c0._16_8_ = 0;
  local_98 = 0;
  local_a0 = (_Base_ptr)local_c0._24_8_;
  if (bVar10 != 0) {
    pcVar4 = this->Target;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"INSTALL_RPATH","");
    pcVar11 = cmGeneratorTarget::GetProperty(pcVar4,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    cmCLI_ExpandListUnique
              (pcVar11,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_c8,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c0);
  }
  if (bVar20 == 0) {
    if ((char)local_ec == '\0') goto LAB_002d6359;
  }
  else {
    pcVar4 = this->Target;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"BUILD_RPATH","");
    pcVar11 = cmGeneratorTarget::GetProperty(pcVar4,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (pcVar11 != (char *)0x0) {
      cmCLI_ExpandListUnique
                (pcVar11,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_c8,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c0);
    }
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_allocated_capacity =
       local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pcVar2 = this->Makefile;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CMAKE_SYSROOT_LINK","");
  pcVar11 = cmMakefile::GetDefinition(pcVar2,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  sVar3 = local_110._M_string_length;
  local_38 = psVar15;
  if (pcVar11 == (char *)0x0) {
    pcVar2 = this->Makefile;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar2,&local_138);
    std::__cxx11::string::_M_assign((string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    strlen(pcVar11);
    std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)sVar3,(ulong)pcVar11);
  }
  pcVar2 = this->Makefile;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CMAKE_STAGING_PREFIX","");
  pcVar11 = cmMakefile::GetDefinition(pcVar2,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->Makefile;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CMAKE_INSTALL_PREFIX","");
  local_60 = cmMakefile::GetSafeDefinition(pcVar2,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&local_110);
  pvVar12 = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_(this->OrderRuntimeSearchPath);
  local_90 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  pbVar19 = (pvVar12->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pvVar12->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar19 != pbVar5) {
    bVar10 = bVar7 & local_112 & local_111;
    do {
      if (bVar20 == 0) {
        if ((char)local_ec != '\0') {
          psVar15 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
          bVar7 = cmsys::SystemTools::ComparePath(pbVar19,psVar15);
          if ((((!bVar7) && (bVar7 = cmsys::SystemTools::ComparePath(pbVar19,local_90), !bVar7)) &&
              (bVar7 = cmsys::SystemTools::IsSubDirectory(pbVar19,psVar15), !bVar7)) &&
             (bVar7 = cmsys::SystemTools::IsSubDirectory(pbVar19,local_90), !bVar7)) {
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            pcVar6 = (pbVar19->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_138,pcVar6,pcVar6 + pbVar19->_M_string_length);
            if (((char *)local_110._M_string_length == (char *)0x0) ||
               (lVar13 = std::__cxx11::string::find
                                   ((char *)&local_138,(ulong)local_110._M_dataplus._M_p,0),
               lVar13 != 0)) {
              if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
                strlen(pcVar11);
                lVar13 = std::__cxx11::string::find((char *)&local_138,(ulong)pcVar11,0);
                if (lVar13 == 0) {
                  strlen(pcVar11);
                  std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_138);
                  std::__cxx11::string::_M_assign((string *)&local_138);
                  std::__cxx11::string::append((char *)&local_138);
                  std::__cxx11::string::_M_append
                            ((char *)&local_138,(ulong)local_e8._M_dataplus._M_p);
                  cmsys::SystemTools::ConvertToUnixSlashes(&local_138);
                  goto LAB_002d62eb;
                }
              }
            }
            else {
              std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_138);
              std::__cxx11::string::operator=((string *)&local_138,(string *)&local_e8);
LAB_002d62eb:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            pVar23 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)local_c0,&local_138);
            if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_c8,&local_138);
            }
            goto LAB_002d6299;
          }
        }
      }
      else {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        pcVar6 = (pbVar19->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,pcVar6,pcVar6 + pbVar19->_M_string_length);
        if (((char *)local_110._M_string_length == (char *)0x0) ||
           (lVar13 = std::__cxx11::string::find
                               ((char *)&local_138,(ulong)local_110._M_dataplus._M_p,0), lVar13 != 0
           )) {
          if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
            strlen(pcVar11);
            lVar13 = std::__cxx11::string::find((char *)&local_138,(ulong)pcVar11,0);
            if (lVar13 == 0) {
              strlen(pcVar11);
              std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_138);
              std::__cxx11::string::_M_assign((string *)&local_138);
              std::__cxx11::string::append((char *)&local_138);
              std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_e8._M_dataplus._M_p);
              cmsys::SystemTools::ConvertToUnixSlashes(&local_138);
              goto LAB_002d61e0;
            }
          }
          if ((bVar10 != 0) &&
             ((bVar7 = cmsys::SystemTools::ComparePath(&local_138,local_90), bVar7 ||
              (bVar7 = cmsys::SystemTools::IsSubDirectory(&local_138,local_90), bVar7)))) {
            cmSystemTools::RelativePath(&local_e8,&local_80,&local_138);
            std::__cxx11::string::operator=((string *)&local_138,(string *)&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if (local_138._M_string_length == 0) {
              std::__cxx11::string::_M_assign((string *)&local_138);
            }
            else {
              local_58[0] = &local_48;
              pcVar6 = (local_88->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_58,pcVar6,pcVar6 + local_88->_M_string_length);
              std::__cxx11::string::append((char *)local_58);
              plVar14 = (long *)std::__cxx11::string::_M_append
                                          ((char *)local_58,(ulong)local_138._M_dataplus._M_p);
              psVar17 = (size_type *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar17) {
                local_e8.field_2._M_allocated_capacity = *psVar17;
                local_e8.field_2._8_8_ = plVar14[3];
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              }
              else {
                local_e8.field_2._M_allocated_capacity = *psVar17;
                local_e8._M_dataplus._M_p = (pointer)*plVar14;
              }
              local_e8._M_string_length = plVar14[1];
              *plVar14 = (long)psVar17;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_138,(string *)&local_e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              uVar21 = local_48._M_allocated_capacity;
              _Var22._M_p = (pointer)local_58[0];
              if (local_58[0] != &local_48) goto LAB_002d626c;
            }
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_138);
          std::__cxx11::string::operator=((string *)&local_138,(string *)&local_e8);
LAB_002d61e0:
          uVar21 = local_e8.field_2._M_allocated_capacity;
          _Var22._M_p = local_e8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_002d626c:
            operator_delete(_Var22._M_p,uVar21 + 1);
          }
        }
        pVar23 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)local_c0,&local_138);
        if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_c8,&local_138);
        }
LAB_002d6299:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 != pbVar5);
  }
  psVar15 = local_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    psVar15 = local_38;
  }
LAB_002d6359:
  pLVar16 = cmGeneratorTarget::GetLinkClosure(this->Target,psVar15);
  pbVar19 = (pLVar16->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pLVar16->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar19 != pbVar5) {
    paVar1 = &local_138.field_2;
    do {
      std::operator+(&local_138,"CMAKE_",pbVar19);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_138);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      puVar18 = (ulong *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_110.field_2._M_allocated_capacity = *puVar18;
        local_110.field_2._8_8_ = plVar14[3];
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar18;
        local_110._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_110._M_string_length = plVar14[1];
      *plVar14 = (long)puVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      bVar7 = cmMakefile::IsOn(this->Makefile,&local_110);
      if (bVar7) {
        std::operator+(&local_e8,"CMAKE_",pbVar19);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_e8);
        psVar17 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_138.field_2._M_allocated_capacity = *psVar17;
          local_138.field_2._8_8_ = plVar14[3];
          local_138._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar17;
          local_138._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_138._M_string_length = plVar14[1];
        *plVar14 = (long)psVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        pcVar11 = cmMakefile::GetDefinition(this->Makefile,&local_138);
        if (pcVar11 != (char *)0x0) {
          cmCLI_ExpandListUnique
                    (pcVar11,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_c8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 != pbVar5);
  }
  cmCLI_ExpandListUnique
            ((this->RuntimeAlways)._M_dataplus._M_p,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c8,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    const char* install_rpath = this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    if (const char* build_rpath = this->Target->GetProperty("BUILD_RPATH")) {
      // This will not resolve entries to use $ORIGIN, the user is expected to
      // do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (const char* sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    const char* stagePath =
      this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && d.find(rootPath) == 0) {
          d = d.substr(rootPath.size());
        } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = originToken + "/" + d;
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && d.find(rootPath) == 0) {
            d = d.substr(rootPath.size());
          } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar =
        "CMAKE_" + li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + li + "_IMPLICIT_LINK_DIRECTORIES";
        if (const char* dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}